

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiView.cpp
# Opt level: O3

ChannelList *
anon_unknown.dwarf_25af76::buildList(ChannelList *__return_storage_ptr__,char *name,...)

{
  _Rb_tree_header *p_Var1;
  char in_AL;
  void **ppvVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_f0;
  Channel local_d8 [16];
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0 = &ap[0].overflow_arg_area;
  uVar3 = 0x10;
  if (name != (char *)0x0) {
    local_c8[2] = (void *)in_RDX;
    local_c8[3] = (void *)in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    do {
      Imf_3_2::Channel::Channel(local_d8,HALF,1,1,false);
      Imf_3_2::ChannelList::insert((char *)__return_storage_ptr__,(Channel *)name);
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        ppvVar2 = (void **)((long)local_c8 + uVar4);
      }
      else {
        ppvVar2 = local_f0;
        local_f0 = local_f0 + 1;
      }
      name = (char *)*ppvVar2;
    } while ((Channel *)name != (Channel *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ChannelList
buildList (const char* name, ...)
{
    //
    // nice function to build channel lists
    //

    ChannelList list;
    const char* channelName = name;

    va_list ap;
    va_start (ap, name);

    while (channelName != 0)
    {
        list.insert (channelName, Channel ());
        channelName = va_arg (ap, char*);
    }

    va_end (ap);
    return list;
}